

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pagerFixMaplimit(Pager *pPager)

{
  long lVar1;
  Pager *in_RDI;
  long in_FS_OFFSET;
  sqlite3_file *fd;
  sqlite3_int64 sz;
  int in_stack_ffffffffffffffdc;
  sqlite3_file *id;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  id = in_RDI->fd;
  if ((id->pMethods != (sqlite3_io_methods *)0x0) && (2 < id->pMethods->iVersion)) {
    in_RDI->bUseFetch = 0 < in_RDI->szMmap;
    setGetterMethod(in_RDI);
    sqlite3OsFileControlHint(id,in_stack_ffffffffffffffdc,(void *)0x166fe7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void pagerFixMaplimit(Pager *pPager){
#if SQLITE_MAX_MMAP_SIZE>0
  sqlite3_file *fd = pPager->fd;
  if( isOpen(fd) && fd->pMethods->iVersion>=3 ){
    sqlite3_int64 sz;
    sz = pPager->szMmap;
    pPager->bUseFetch = (sz>0);
    setGetterMethod(pPager);
    sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_MMAP_SIZE, &sz);
  }
#endif
}